

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22652::
ARTIteratorTest_singleLeafSeek_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTIteratorTest_singleLeafSeek_Test
          (ARTIteratorTest_singleLeafSeek_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, singleLeafSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[1]);
  {  // exact match, forward traversal (GTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_EQ(match, true);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // exact match, reverse traversal (LTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_TRUE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());  // nothing more in the iterator.
  }
  {  // forward traversal, before the first key in the data.
    // match=false and iterator is positioned on the first key in the
    // data.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // forward traversal, after the last key in the data.  match=false
    // and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            true /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, before the first key in the data.
    // match=false and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            false /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, after the last key in the data.  match=false
    // and iterator is positioned at the last key.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
}